

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ushort uVar2;
  ostream *poVar3;
  Am_Object *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Method_Wrapper *pAVar6;
  Am_Object local_88 [8];
  Am_Object local_80 [8];
  Am_Object local_78 [8];
  Am_Object local_70 [8];
  Am_Object gesture1;
  Am_Object local_60 [8];
  Am_Object local_58 [8];
  Am_Object gesture1_feedback;
  Am_Object local_48 [8];
  Am_Object local_40 [8];
  Am_Object window;
  Am_Gesture_Classifier local_20 [8];
  Am_Gesture_Classifier gc;
  char **argv_local;
  int argc_local;
  
  _gc = argv;
  Am_Gesture_Classifier::Am_Gesture_Classifier(local_20);
  Am_Initialize();
  if (1 < argc) {
    Am_Gesture_Classifier::Am_Gesture_Classifier((Am_Gesture_Classifier *)&window,_gc[1]);
    Am_Gesture_Classifier::operator=(local_20,(Am_Gesture_Classifier *)&window);
    Am_Gesture_Classifier::~Am_Gesture_Classifier((Am_Gesture_Classifier *)&window);
    bVar1 = Am_Gesture_Classifier::Valid();
    if ((bVar1 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"can\'t open %s\n");
      poVar3 = std::operator<<(poVar3,_gc[1]);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
  }
  Am_Object::Create((char *)local_48);
  uVar2 = Am_Object::Set((ushort)local_48,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x32);
  uVar2 = Am_Object::Set(uVar2,0x66,500);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,0x67,500);
  Am_Object::Am_Object(local_40,pAVar4);
  Am_Object::~Am_Object(local_48);
  Am_Object::Am_Object(&gesture1_feedback,local_40);
  Am_Object::Add_Part(&Am_Screen,&gesture1_feedback,1,0);
  Am_Object::~Am_Object(&gesture1_feedback);
  Am_Object::Create((char *)local_60);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)local_60,0x6a,0);
  Am_Object::Am_Object(local_58,pAVar4);
  Am_Object::~Am_Object(local_60);
  Am_Object::Am_Object(&gesture1,local_58);
  Am_Object::Add_Part(local_40,&gesture1,1,0);
  Am_Object::~Am_Object(&gesture1);
  Am_Object::Create((char *)local_78);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(local_58);
  uVar2 = Am_Object::Set((ushort)local_78,(Am_Wrapper *)0xdc,(ulong)pAVar5);
  pAVar5 = Am_Gesture_Classifier::operator_cast_to_Am_Wrapper_(local_20);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x140,(ulong)pAVar5);
  uVar2 = Am_Object::Set(uVar2,0.95,0x143);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar2,0x144,200);
  Am_Object::Am_Object(local_70,pAVar4);
  Am_Object::~Am_Object(local_78);
  Am_Object::Get_Object((ushort)local_80,(ulong)local_70);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&Gesture1_Do);
  Am_Object::Set((ushort)local_80,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::~Am_Object(local_80);
  Am_Object::Am_Object(local_88,local_70);
  Am_Object::Add_Part(local_40,local_88,1,0);
  Am_Object::~Am_Object(local_88);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(local_70);
  Am_Object::~Am_Object(local_58);
  Am_Object::~Am_Object(local_40);
  Am_Gesture_Classifier::~Am_Gesture_Classifier(local_20);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  Am_Gesture_Classifier gc;

  Am_Initialize();

  if (argc > 1) {
    gc = Am_Gesture_Classifier(argv[1]);
    if (!gc.Valid()) {
      cerr << "can't open %s\n" << argv[1] << endl;
      exit(-1);
    }
  }

  Am_Object window = Am_Window.Create("window")
                         .Set(Am_LEFT, 20)
                         .Set(Am_TOP, 50)
                         .Set(Am_WIDTH, 500)
                         .Set(Am_HEIGHT, 500);
  Am_Screen.Add_Part(window);

  Am_Object gesture1_feedback =
      Am_Polygon.Create("gesture1_feedback").Set(Am_FILL_STYLE, (0L));
  window.Add_Part(gesture1_feedback);

  Am_Object gesture1 = Am_Gesture_Interactor.Create("gesture1")
                           .Set(Am_FEEDBACK_OBJECT, gesture1_feedback)
                           .Set(Am_CLASSIFIER, gc)
                           .Set(Am_MIN_NONAMBIGUITY_PROB, 0.95)
                           .Set(Am_MAX_DIST_TO_MEAN, 200);
  gesture1.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, Gesture1_Do);
  window.Add_Part(gesture1);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}